

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test.cpp
# Opt level: O1

bool save_png(char *pFilename,image_u8 *img,bool save_alpha)

{
  uint h;
  uint uVar1;
  uint uVar2;
  pointer puVar3;
  uint uVar4;
  vector<unsigned_char,_std::allocator<unsigned_char>_> pixels;
  allocator<char> local_59;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_58;
  string local_40;
  
  uVar2 = img->m_width;
  h = img->m_height;
  local_58.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (uint8_t *)0x0;
  local_58.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_58.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
            (&local_58,(ulong)(uVar2 * h * 3));
  if (h != 0) {
    uVar1 = 0;
    puVar3 = local_58.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_start;
    do {
      if (uVar2 != 0) {
        uVar4 = 0;
        do {
          *puVar3 = (img->m_pixels).
                    super__Vector_base<color_quad_u8,_std::allocator<color_quad_u8>_>._M_impl.
                    super__Vector_impl_data._M_start[img->m_width * uVar1 + uVar4].m_c[0];
          puVar3[1] = (img->m_pixels).
                      super__Vector_base<color_quad_u8,_std::allocator<color_quad_u8>_>._M_impl.
                      super__Vector_impl_data._M_start[img->m_width * uVar1 + uVar4].m_c[1];
          puVar3[2] = (img->m_pixels).
                      super__Vector_base<color_quad_u8,_std::allocator<color_quad_u8>_>._M_impl.
                      super__Vector_impl_data._M_start[img->m_width * uVar1 + uVar4].m_c[2];
          uVar4 = uVar4 + 1;
          puVar3 = puVar3 + 3;
        } while (uVar2 != uVar4);
      }
      uVar1 = uVar1 + 1;
    } while (uVar1 != h);
  }
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_40,pFilename,&local_59);
  uVar2 = lodepng::encode(&local_40,&local_58,uVar2,h,LCT_RGB,8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != &local_40.field_2) {
    operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
  }
  if (local_58.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (uint8_t *)0x0) {
    operator_delete(local_58.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_58.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_58.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  return uVar2 == 0;
}

Assistant:

static bool save_png(const char *pFilename, const image_u8 &img, bool save_alpha)
{
	const uint32_t w = img.width();
	const uint32_t h = img.height();

	std::vector<unsigned char> pixels;
	if (save_alpha)
	{
		pixels.resize(w * h * sizeof(color_quad_u8));
		memcpy(&pixels[0], &img.get_pixels()[0], w * h * sizeof(color_quad_u8));
	}
	else
	{
		pixels.resize(w * h * 3);
		unsigned char *pDst = &pixels[0];
		for (uint32_t y = 0; y < h; y++)
			for (uint32_t x = 0; x < w; x++, pDst += 3)
				pDst[0] = img(x, y)[0], pDst[1] = img(x, y)[1], pDst[2] = img(x, y)[2];
	}
	
	return lodepng::encode(pFilename, pixels, w, h, save_alpha ? LCT_RGBA : LCT_RGB) == 0;
}